

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_iwad.cpp
# Opt level: O0

void __thiscall FIWadManager::ParseIWadInfo(FIWadManager *this,char *fn,char *data,int datasize)

{
  bool bVar1;
  uint uVar2;
  DWORD DVar3;
  int iVar4;
  TArray<FString,_FString> *pTVar5;
  char *pcVar6;
  FString local_160;
  FString wadname;
  FString local_150;
  FString local_148;
  FIWADInfo *local_140;
  FIWADInfo *iwad;
  undefined1 local_128 [8];
  FScanner sc;
  int datasize_local;
  char *data_local;
  char *fn_local;
  FIWadManager *this_local;
  
  sc._252_4_ = datasize;
  FScanner::FScanner((FScanner *)local_128);
  FScanner::OpenMem((FScanner *)local_128,"IWADINFO",data,sc._252_4_);
  while (bVar1 = FScanner::GetString((FScanner *)local_128), bVar1) {
    bVar1 = FScanner::Compare((FScanner *)local_128,"IWAD");
    if (bVar1) {
      uVar2 = TArray<FIWADInfo,_FIWADInfo>::Reserve(&this->mIWads,1);
      local_140 = TArray<FIWADInfo,_FIWADInfo>::operator[](&this->mIWads,(ulong)uVar2);
      FScanner::MustGetStringName((FScanner *)local_128,"{");
      while (bVar1 = FScanner::CheckString((FScanner *)local_128,"}"), ((bVar1 ^ 0xffU) & 1) != 0) {
        FScanner::MustGetString((FScanner *)local_128);
        bVar1 = FScanner::Compare((FScanner *)local_128,"Name");
        if (bVar1) {
          FScanner::MustGetStringName((FScanner *)local_128,"=");
          FScanner::MustGetString((FScanner *)local_128);
          FString::operator=(&local_140->Name,(char *)local_128);
        }
        else {
          bVar1 = FScanner::Compare((FScanner *)local_128,"Autoname");
          if (bVar1) {
            FScanner::MustGetStringName((FScanner *)local_128,"=");
            FScanner::MustGetString((FScanner *)local_128);
            FString::operator=(&local_140->Autoname,(char *)local_128);
          }
          else {
            bVar1 = FScanner::Compare((FScanner *)local_128,"Config");
            if (bVar1) {
              FScanner::MustGetStringName((FScanner *)local_128,"=");
              FScanner::MustGetString((FScanner *)local_128);
              FString::operator=(&local_140->Configname,(char *)local_128);
            }
            else {
              bVar1 = FScanner::Compare((FScanner *)local_128,"Game");
              if (bVar1) {
                FScanner::MustGetStringName((FScanner *)local_128,"=");
                FScanner::MustGetString((FScanner *)local_128);
                bVar1 = FScanner::Compare((FScanner *)local_128,"Doom");
                if (bVar1) {
                  local_140->gametype = GAME_Doom;
                }
                else {
                  bVar1 = FScanner::Compare((FScanner *)local_128,"Heretic");
                  if (bVar1) {
                    local_140->gametype = GAME_Heretic;
                  }
                  else {
                    bVar1 = FScanner::Compare((FScanner *)local_128,"Hexen");
                    if (bVar1) {
                      local_140->gametype = GAME_Hexen;
                    }
                    else {
                      bVar1 = FScanner::Compare((FScanner *)local_128,"Strife");
                      if (bVar1) {
                        local_140->gametype = GAME_Strife;
                      }
                      else {
                        bVar1 = FScanner::Compare((FScanner *)local_128,"Chex");
                        if (bVar1) {
                          local_140->gametype = GAME_Chex;
                        }
                        else {
                          FScanner::ScriptError((FScanner *)local_128,(char *)0x0);
                        }
                      }
                    }
                  }
                }
              }
              else {
                bVar1 = FScanner::Compare((FScanner *)local_128,"Mapinfo");
                if (bVar1) {
                  FScanner::MustGetStringName((FScanner *)local_128,"=");
                  FScanner::MustGetString((FScanner *)local_128);
                  FString::operator=(&local_140->MapInfo,(char *)local_128);
                }
                else {
                  bVar1 = FScanner::Compare((FScanner *)local_128,"Compatibility");
                  if (bVar1) {
                    FScanner::MustGetStringName((FScanner *)local_128,"=");
                    do {
                      FScanner::MustGetString((FScanner *)local_128);
                      bVar1 = FScanner::Compare((FScanner *)local_128,"NoTextcolor");
                      if (bVar1) {
                        local_140->flags = local_140->flags | 0x100;
                      }
                      else {
                        bVar1 = FScanner::Compare((FScanner *)local_128,"Poly1");
                        if (bVar1) {
                          local_140->flags = local_140->flags | 0x40;
                        }
                        else {
                          bVar1 = FScanner::Compare((FScanner *)local_128,"Poly2");
                          if (bVar1) {
                            local_140->flags = local_140->flags | 0x80;
                          }
                          else {
                            bVar1 = FScanner::Compare((FScanner *)local_128,"Shareware");
                            if (bVar1) {
                              local_140->flags = local_140->flags | 2;
                            }
                            else {
                              bVar1 = FScanner::Compare((FScanner *)local_128,"Teaser2");
                              if (bVar1) {
                                local_140->flags = local_140->flags | 8;
                              }
                              else {
                                bVar1 = FScanner::Compare((FScanner *)local_128,"Extended");
                                if (bVar1) {
                                  local_140->flags = local_140->flags | 4;
                                }
                                else {
                                  bVar1 = FScanner::Compare((FScanner *)local_128,"Shorttex");
                                  if (bVar1) {
                                    local_140->flags = local_140->flags | 0x10;
                                  }
                                  else {
                                    bVar1 = FScanner::Compare((FScanner *)local_128,"Stairs");
                                    if (bVar1) {
                                      local_140->flags = local_140->flags | 0x20;
                                    }
                                    else {
                                      FScanner::ScriptError((FScanner *)local_128,(char *)0x0);
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                      bVar1 = FScanner::CheckString((FScanner *)local_128,",");
                    } while (bVar1);
                  }
                  else {
                    bVar1 = FScanner::Compare((FScanner *)local_128,"MustContain");
                    if (bVar1) {
                      FScanner::MustGetStringName((FScanner *)local_128,"=");
                      do {
                        FScanner::MustGetString((FScanner *)local_128);
                        pTVar5 = &local_140->Lumps;
                        FString::FString(&local_148,(char *)local_128);
                        TArray<FString,_FString>::Push(pTVar5,&local_148);
                        FString::~FString(&local_148);
                        bVar1 = FScanner::CheckString((FScanner *)local_128,",");
                      } while (bVar1);
                    }
                    else {
                      bVar1 = FScanner::Compare((FScanner *)local_128,"BannerColors");
                      if (bVar1) {
                        FScanner::MustGetStringName((FScanner *)local_128,"=");
                        FScanner::MustGetString((FScanner *)local_128);
                        DVar3 = V_GetColor((DWORD *)0x0,(char *)local_128);
                        local_140->FgColor = DVar3;
                        FScanner::MustGetStringName((FScanner *)local_128,",");
                        FScanner::MustGetString((FScanner *)local_128);
                        DVar3 = V_GetColor((DWORD *)0x0,(char *)local_128);
                        local_140->BkColor = DVar3;
                      }
                      else {
                        bVar1 = FScanner::Compare((FScanner *)local_128,"Load");
                        if (bVar1) {
                          FScanner::MustGetStringName((FScanner *)local_128,"=");
                          do {
                            FScanner::MustGetString((FScanner *)local_128);
                            pTVar5 = &local_140->Load;
                            FString::FString(&local_150,(char *)local_128);
                            TArray<FString,_FString>::Push(pTVar5,&local_150);
                            FString::~FString(&local_150);
                            bVar1 = FScanner::CheckString((FScanner *)local_128,",");
                          } while (bVar1);
                        }
                        else {
                          bVar1 = FScanner::Compare((FScanner *)local_128,"Required");
                          if (bVar1) {
                            FScanner::MustGetStringName((FScanner *)local_128,"=");
                            FScanner::MustGetString((FScanner *)local_128);
                            FString::operator=(&local_140->Required,(char *)local_128);
                          }
                          else {
                            FScanner::ScriptError
                                      ((FScanner *)local_128,"Unknown keyword \'%s\'",local_128);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      bVar1 = FString::IsEmpty(&local_140->MapInfo);
      if (bVar1) {
        FString::operator=(&local_140->MapInfo,"mapinfo/mindefaults.txt");
      }
    }
    else {
      bVar1 = FScanner::Compare((FScanner *)local_128,"NAMES");
      if (bVar1) {
        FScanner::MustGetStringName((FScanner *)local_128,"{");
        FString::FString(&wadname);
        TArray<FString,_FString>::Push(&this->mIWadNames,&wadname);
        FString::~FString(&wadname);
        while (bVar1 = FScanner::CheckString((FScanner *)local_128,"}"), ((bVar1 ^ 0xffU) & 1) != 0)
        {
          FScanner::MustGetString((FScanner *)local_128);
          FString::FString(&local_160,(char *)local_128);
          FString::ToLower(&local_160);
          TArray<FString,_FString>::Push(&this->mIWadNames,&local_160);
          pcVar6 = FString::operator[](&local_160,0);
          iVar4 = toupper((int)*pcVar6);
          pcVar6 = FString::LockBuffer(&local_160);
          *pcVar6 = (char)iVar4;
          FString::UnlockBuffer(&local_160);
          TArray<FString,_FString>::Push(&this->mIWadNames,&local_160);
          FString::ToUpper(&local_160);
          TArray<FString,_FString>::Push(&this->mIWadNames,&local_160);
          FString::~FString(&local_160);
        }
      }
    }
  }
  FScanner::~FScanner((FScanner *)local_128);
  return;
}

Assistant:

void FIWadManager::ParseIWadInfo(const char *fn, const char *data, int datasize)
{
	FScanner sc;

	sc.OpenMem("IWADINFO", data, datasize);
	while (sc.GetString())
	{
		if (sc.Compare("IWAD"))
		{
			FIWADInfo *iwad = &mIWads[mIWads.Reserve(1)];
			sc.MustGetStringName("{");
			while (!sc.CheckString("}"))
			{
				sc.MustGetString();
				if (sc.Compare("Name"))
				{
					sc.MustGetStringName("=");
					sc.MustGetString();
					iwad->Name = sc.String;
				}
				else if (sc.Compare("Autoname"))
				{
					sc.MustGetStringName("=");
					sc.MustGetString();
					iwad->Autoname = sc.String;
				}
				else if (sc.Compare("Config"))
				{
					sc.MustGetStringName("=");
					sc.MustGetString();
					iwad->Configname = sc.String;
				}
				else if (sc.Compare("Game"))
				{
					sc.MustGetStringName("=");
					sc.MustGetString();
					if (sc.Compare("Doom")) iwad->gametype = GAME_Doom;
					else if (sc.Compare("Heretic")) iwad->gametype = GAME_Heretic;
					else if (sc.Compare("Hexen")) iwad->gametype = GAME_Hexen;
					else if (sc.Compare("Strife")) iwad->gametype = GAME_Strife;
					else if (sc.Compare("Chex")) iwad->gametype = GAME_Chex;
					else sc.ScriptError(NULL);
				}
				else if (sc.Compare("Mapinfo"))
				{
					sc.MustGetStringName("=");
					sc.MustGetString();
					iwad->MapInfo = sc.String;
				}
				else if (sc.Compare("Compatibility"))
				{
					sc.MustGetStringName("=");
					do
					{
						sc.MustGetString();
						if(sc.Compare("NoTextcolor")) iwad->flags |= GI_NOTEXTCOLOR;
						else if(sc.Compare("Poly1")) iwad->flags |= GI_COMPATPOLY1;
						else if(sc.Compare("Poly2")) iwad->flags |= GI_COMPATPOLY2;
						else if(sc.Compare("Shareware")) iwad->flags |= GI_SHAREWARE;
						else if(sc.Compare("Teaser2")) iwad->flags |= GI_TEASER2;
						else if(sc.Compare("Extended")) iwad->flags |= GI_MENUHACK_EXTENDED;
						else if(sc.Compare("Shorttex")) iwad->flags |= GI_COMPATSHORTTEX;
						else if(sc.Compare("Stairs")) iwad->flags |= GI_COMPATSTAIRS;
						else sc.ScriptError(NULL);
					}
					while (sc.CheckString(","));
				}
				else if (sc.Compare("MustContain"))
				{
					sc.MustGetStringName("=");
					do
					{
						sc.MustGetString();
						iwad->Lumps.Push(FString(sc.String));
					}
					while (sc.CheckString(","));
				}
				else if (sc.Compare("BannerColors"))
				{
					sc.MustGetStringName("=");
					sc.MustGetString();
					iwad->FgColor = V_GetColor(NULL, sc.String);
					sc.MustGetStringName(",");
					sc.MustGetString();
					iwad->BkColor = V_GetColor(NULL, sc.String);
				}
				else if (sc.Compare("Load"))
				{
					sc.MustGetStringName("=");
					do
					{
						sc.MustGetString();
						iwad->Load.Push(FString(sc.String));
					}
					while (sc.CheckString(","));
				}
				else if (sc.Compare("Required"))
				{
					sc.MustGetStringName("=");
					sc.MustGetString();
					iwad->Required = sc.String;
				}
				else
				{
					sc.ScriptError("Unknown keyword '%s'", sc.String);
				}
			}
			if (iwad->MapInfo.IsEmpty())
			{
				// We must at least load the minimum defaults to allow the engine to run.
				iwad->MapInfo = "mapinfo/mindefaults.txt";
			}
		}
		else if (sc.Compare("NAMES"))
		{
			sc.MustGetStringName("{");
			mIWadNames.Push(FString());
			while (!sc.CheckString("}"))
			{
				sc.MustGetString();
				FString wadname = sc.String;
#if defined(_WIN32) || defined(__APPLE__) // Turns out Mac OS X is case insensitive.
				mIWadNames.Push(wadname);
#else
				// check for lowercase, uppercased first letter and full uppercase on Linux etc.
				wadname.ToLower();
				mIWadNames.Push(wadname);
				wadname.LockBuffer()[0] = toupper(wadname[0]);
				wadname.UnlockBuffer();
				mIWadNames.Push(wadname);
				wadname.ToUpper();
				mIWadNames.Push(wadname);
#endif
			}
		}
	}
}